

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O0

HdmiCecAnalyzerResults * __thiscall
HdmiCecAnalyzerResults::GetNumberString_abi_cxx11_(HdmiCecAnalyzerResults *this,U64 number,int bits)

{
  uint in_ECX;
  undefined4 in_register_00000014;
  allocator local_a9;
  char local_a8 [8];
  char str [128];
  int strLen;
  int bits_local;
  U64 number_local;
  HdmiCecAnalyzerResults *this_local;
  
  str[0x78] = -0x80;
  str[0x79] = '\0';
  str[0x7a] = '\0';
  str[0x7b] = '\0';
  AnalyzerHelpers::GetNumberString
            (CONCAT44(in_register_00000014,bits),*(DisplayBase *)(number + 0x20),in_ECX,local_a8,
             0x80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,local_a8,&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  return this;
}

Assistant:

std::string HdmiCecAnalyzerResults::GetNumberString( U64 number, int bits )
{
    const int strLen = 128;
    char str[ strLen ];
    AnalyzerHelpers::GetNumberString( number, mDisplayBase, bits, str, strLen );
    return std::string( str );
}